

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playermenu.cpp
# Opt level: O3

void __thiscall FSliderItem::DrawSlider(FSliderItem *this,int x,int y)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int x_00;
  int y_00;
  
  iVar1 = this->mMinrange;
  iVar2 = this->mMaxrange;
  iVar3 = this->mSelection;
  x_00 = (screen->super_DSimpleCanvas).super_DCanvas.Width / 2 + (x + -0xa0) * CleanXfac;
  y_00 = (screen->super_DSimpleCanvas).super_DCanvas.Height / 2 + (y + -100) * CleanYfac;
  DCanvas::DrawText((DCanvas *)screen,ConFont,9,x_00,y_00,
                    "\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12",0x400013b8,
                    (ulong)(uint)(CleanXfac << 3),0x400013b9,(ulong)(uint)(CleanYfac << 3),0);
  DCanvas::DrawText((DCanvas *)screen,ConFont,8,
                    (((iVar3 - iVar1) * 0x4e) / (iVar2 - iVar1) + 5) * CleanXfac + x_00,y_00,"\x13",
                    0x400013b8,(ulong)(uint)(CleanXfac << 3),0x400013b9,
                    (ulong)(uint)(CleanYfac << 3),0);
  return;
}

Assistant:

void FSliderItem::DrawSlider (int x, int y)
{
	int range = mMaxrange - mMinrange;
	int cur = mSelection - mMinrange;

	x = (x - 160) * CleanXfac + screen->GetWidth() / 2;
	y = (y - 100) * CleanYfac + screen->GetHeight() / 2;

	screen->DrawText (ConFont, CR_WHITE, x, y,
		"\x10\x11\x11\x11\x11\x11\x11\x11\x11\x11\x11\x12",
		DTA_CellX, 8 * CleanXfac,
		DTA_CellY, 8 * CleanYfac,
		TAG_DONE);
	screen->DrawText (ConFont, CR_ORANGE, x + (5 + (int)((cur * 78) / range)) * CleanXfac, y,
		"\x13",
		DTA_CellX, 8 * CleanXfac,
		DTA_CellY, 8 * CleanYfac,
		TAG_DONE);
}